

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util_test.cc
# Opt level: O2

void __thiscall FileTest_HashFile_Test::~FileTest_HashFile_Test(FileTest_HashFile_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(FileTest, HashFile) {
  FILE* file_1 = OpenFileOrDie("./tmp_1", "w");
  FILE* file_2 = OpenFileOrDie("./tmp_2", "w");
  FILE* file_3 = OpenFileOrDie("./tmp_3", "w");
  std::string str_1("affadada32sfsfsdse23");
  std::string str_2("jnfdj3278hjsldjksjd88ds");
  WriteStringToFile(file_1, str_1);
  WriteStringToFile(file_2, str_1);
  WriteStringToFile(file_3, str_2);
  Close(file_1);
  Close(file_2);
  Close(file_3);
  EXPECT_EQ(HashFile("./tmp_1"), HashFile("./tmp_2"));
  EXPECT_NE(HashFile("./tmp_2"), HashFile("./tmp_3"));
  RemoveFile("./tmp_1");
  RemoveFile("./tmp_2");
  RemoveFile("./tmp_3");
}